

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O2

void __thiscall Steiner::plot(Steiner *this,string *plotName)

{
  int iVar1;
  int iVar2;
  pointer pEVar3;
  pointer piVar4;
  pointer pPVar5;
  ostream *poVar6;
  pointer pPVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int i;
  long lVar11;
  pointer pPVar12;
  reference rVar13;
  int local_254;
  string ofileName;
  ofstream of;
  
  std::__cxx11::string::string((string *)&ofileName,(string *)plotName);
  std::ofstream::ofstream(&of,(string *)&ofileName,_S_out);
  poVar6 = std::operator<<((ostream *)&of,"set size ratio -1");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&of,"set nokey");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::operator<<((ostream *)&of,"set xrange[");
  poVar6 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryRight - this->_boundaryLeft) * -0.05);
  std::operator<<(poVar6,":");
  poVar6 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryRight - this->_boundaryLeft) * 1.05);
  poVar6 = std::operator<<(poVar6,"]");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::operator<<((ostream *)&of,"set yrange[");
  poVar6 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryTop - this->_boundaryBottom) * -0.05);
  std::operator<<(poVar6,":");
  poVar6 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryTop - this->_boundaryBottom) * 1.05);
  poVar6 = std::operator<<(poVar6,"]");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&of,"set object ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
  poVar6 = std::operator<<(poVar6," rect from ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->_boundaryLeft);
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->_boundaryBottom);
  poVar6 = std::operator<<(poVar6," to ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->_boundaryRight);
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->_boundaryTop);
  std::operator<<(poVar6,"fc rgb \"grey\" behind\n");
  lVar9 = 0;
  for (lVar11 = 0; lVar11 < this->_init_p; lVar11 = lVar11 + 1) {
    poVar6 = std::operator<<((ostream *)&of,"set object circle at first ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,*(int *)((long)&((this->_points).
                                                super__Vector_base<Point,_std::allocator<Point>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->x + lVar9
                                       ));
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,*(int *)((long)&((this->_points).
                                                super__Vector_base<Point,_std::allocator<Point>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->y + lVar9
                                       ));
    poVar6 = std::operator<<(poVar6," radius char 0.3 fillstyle solid ");
    std::operator<<(poVar6,"fc rgb \"red\" front\n");
    lVar9 = lVar9 + 0x20;
  }
  local_254 = 2;
  lVar9 = 4;
  uVar10 = 0;
  while( true ) {
    pEVar3 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pEVar3) / 0x14) <= uVar10) break;
    iVar1 = *(int *)((long)pEVar3 + lVar9 + -4);
    pPVar12 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar2 = *(int *)((long)&pEVar3->p1 + lVar9);
    poVar6 = std::operator<<((ostream *)&of,"set arrow ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_254);
    poVar6 = std::operator<<(poVar6," from ");
    pPVar7 = pPVar12 + iVar1;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->y);
    poVar6 = std::operator<<(poVar6," to ");
    pPVar12 = pPVar12 + iVar2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar12->x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar12->y);
    std::operator<<(poVar6," nohead lc rgb \"white\" lw 1 front\n");
    lVar9 = lVar9 + 0x14;
    uVar10 = uVar10 + 1;
    local_254 = local_254 + 1;
  }
  uVar8 = 0;
  while( true ) {
    piVar4 = (this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= (ulong)uVar8) break;
    iVar1 = piVar4[uVar8];
    pPVar12 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start;
    pEVar3 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = pEVar3[iVar1].p1;
    iVar1 = pEVar3[iVar1].p2;
    poVar6 = std::operator<<((ostream *)&of,"set arrow ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar8 + local_254);
    poVar6 = std::operator<<(poVar6," from ");
    pPVar7 = pPVar12 + iVar2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->y);
    poVar6 = std::operator<<(poVar6," to ");
    pPVar12 = pPVar12 + iVar1;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar12->x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar12->y);
    std::operator<<(poVar6," nohead lc rgb \"blue\" lw 1 front\n");
    uVar8 = uVar8 + 1;
  }
  local_254 = local_254 + uVar8;
  for (uVar8 = this->_init_p; uVar10 = (ulong)uVar8,
      uVar10 < (ulong)((long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5); uVar8 = uVar8 + 1) {
    poVar6 = std::operator<<((ostream *)&of,"set object circle at first ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar10].x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar10].y);
    poVar6 = std::operator<<(poVar6," radius char 0.3 fillstyle solid ");
    std::operator<<(poVar6,"fc rgb \"yellow\" front\n");
  }
  uVar8 = 0;
  while( true ) {
    uVar10 = (ulong)uVar8;
    piVar4 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= uVar10) break;
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&this->_edges_del,(long)piVar4[uVar10]);
    if ((*rVar13._M_p & rVar13._M_mask) == 0) {
      iVar1 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      pPVar5 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar3 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = pEVar3[iVar1].p1;
      pPVar12 = pPVar5 + iVar2;
      iVar1 = pEVar3[iVar1].p2;
      pPVar7 = pPVar5 + iVar1;
      if (pPVar5[iVar2].x != pPVar5[iVar1].x) {
        poVar6 = std::operator<<((ostream *)&of,"set arrow ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_254);
        poVar6 = std::operator<<(poVar6," from ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar12->x);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar12->y);
        poVar6 = std::operator<<(poVar6," to ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->x);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar12->y);
        std::operator<<(poVar6," nohead lc rgb \"black\" lw 1.5 front\n");
        local_254 = local_254 + 1;
      }
      if (pPVar12->y != pPVar7->y) {
        poVar6 = std::operator<<((ostream *)&of,"set arrow ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_254);
        poVar6 = std::operator<<(poVar6," from ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->x);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar12->y);
        poVar6 = std::operator<<(poVar6," to ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->x);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->y);
        std::operator<<(poVar6," nohead lc rgb \"black\" lw 1.5 front\n");
        local_254 = local_254 + 1;
      }
    }
    uVar8 = uVar8 + 1;
  }
  uVar8 = 0;
  while( true ) {
    uVar10 = (ulong)uVar8;
    if ((ulong)(((long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x14) <= uVar10) break;
    poVar6 = std::operator<<((ostream *)&of,"set arrow ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_254);
    poVar6 = std::operator<<(poVar6," from ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].p1].x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].p1].y);
    poVar6 = std::operator<<(poVar6," to ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].p2].x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].p1].y);
    std::operator<<(poVar6," nohead lc rgb \"black\" lw 1.5 front\n");
    poVar6 = std::operator<<((ostream *)&of,"set arrow ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_254 + 1);
    poVar6 = std::operator<<(poVar6," from ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].p2].x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].p1].y);
    poVar6 = std::operator<<(poVar6," to ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].p2].x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].p2].y);
    std::operator<<(poVar6," nohead lc rgb \"black\" lw 1.5 front\n");
    uVar8 = uVar8 + 1;
    local_254 = local_254 + 2;
  }
  poVar6 = std::operator<<((ostream *)&of,"plot 1000000000");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&of,"pause -1 \'Press any key\'");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::ofstream::close();
  std::ofstream::~ofstream(&of);
  std::__cxx11::string::~string((string *)&ofileName);
  return;
}

Assistant:

void Steiner::plot(const string& plotName) {
  string ofileName = plotName;
  ofstream of(ofileName, ofstream::out);
  of << "set size ratio -1" << endl;
  of << "set nokey" << endl;
  of << "set xrange["
     << (_boundaryRight - _boundaryLeft) * -0.05 << ":"
     << (_boundaryRight - _boundaryLeft) * 1.05 << "]" << endl;
  of << "set yrange["
     << (_boundaryTop - _boundaryBottom) * -0.05 << ":"
     << (_boundaryTop - _boundaryBottom) * 1.05 << "]" << endl;
  int idx = 1;
  of << "set object " << idx++ << " rect from "
     << _boundaryLeft << "," << _boundaryBottom << " to "
     << _boundaryRight << "," << _boundaryTop << "fc rgb \"grey\" behind\n";
  // point
  for (int i = 0; i < _init_p; ++i) {
    of << "set object circle at first " << _points[i].x << ","
       << _points[i].y << " radius char 0.3 fillstyle solid "
       << "fc rgb \"red\" front\n";
  }
  // RSG
  for (unsigned i = 0; i < _init_edges.size(); ++i) {
    Point& p1 = _points[_init_edges[i].p1];
    Point& p2 = _points[_init_edges[i].p2];
    of << "set arrow " << idx++ << " from "
       << p1.x << "," << p1.y << " to "
       << p2.x << "," << p2.y
       << " nohead lc rgb \"white\" lw 1 front\n";
  }
  // MST
  for (unsigned i = 0; i < _init_MST.size(); ++i) {
    Point& p1 = _points[_init_edges[_init_MST[i]].p1];
    Point& p2 = _points[_init_edges[_init_MST[i]].p2];
    of << "set arrow " << idx++ << " from "
       << p1.x << "," << p1.y << " to "
       << p2.x << "," << p2.y
       << " nohead lc rgb \"blue\" lw 1 front\n";
  }
  // s-point
  for (unsigned i = _init_p; i < _points.size(); ++i) {
    of << "set object circle at first " << _points[i].x << ","
       << _points[i].y << " radius char 0.3 fillstyle solid "
       << "fc rgb \"yellow\" front\n";
  }
  // RST
  for (unsigned i = 0; i < _MST.size(); ++i) {
    if (_edges_del[_MST[i]]) continue;
    Point& p1 = _points[_edges[_MST[i]].p1];
    Point& p2 = _points[_edges[_MST[i]].p2];
    if (p1.x != p2.x) {
      of << "set arrow " << idx++ << " from "
        << p1.x << "," << p1.y << " to "
        << p2.x << "," << p1.y
        << " nohead lc rgb \"black\" lw 1.5 front\n";
    }
    if (p1.y != p2.y) {
      of << "set arrow " << idx++ << " from "
        << p2.x << "," << p1.y << " to "
        << p2.x << "," << p2.y
        << " nohead lc rgb \"black\" lw 1.5 front\n";
    }
  }
  for (unsigned i = 0; i < _newE.size(); ++i) {
    of << "set arrow " << idx++ << " from "
       << _points[_newE[i].p1].x << "," << _points[_newE[i].p1].y << " to "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p1].y
       << " nohead lc rgb \"black\" lw 1.5 front\n";
    of << "set arrow " << idx++ << " from "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p1].y << " to "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p2].y
       << " nohead lc rgb \"black\" lw 1.5 front\n";
  }
  of << "plot 1000000000" << endl;
  of << "pause -1 'Press any key'" << endl;
  of.close();
}